

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

bool tinyxml2::XMLUtil::ToUnsigned(char *str,uint *value)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  bVar1 = IsPrefixHex(str);
  pcVar3 = "%u";
  if (bVar1) {
    pcVar3 = "%x";
  }
  iVar2 = __isoc99_sscanf(str,pcVar3,value);
  return iVar2 == 1;
}

Assistant:

bool XMLUtil::ToUnsigned(const char* str, unsigned* value)
{
    if (TIXML_SSCANF(str, IsPrefixHex(str) ? "%x" : "%u", value) == 1) {
        return true;
    }
    return false;
}